

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void jpgd::Row<8>::idct(int *pTemp,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar4 = ((int)pSrc[6] + (int)pSrc[2]) * 0x1151;
  iVar3 = pSrc[6] * -0x3b21 + iVar4;
  iVar4 = pSrc[2] * 0x187e + iVar4;
  sVar1 = *pSrc;
  sVar2 = pSrc[4];
  iVar9 = (int)pSrc[7];
  iVar7 = (int)pSrc[5];
  iVar5 = (int)pSrc[3];
  iVar8 = (int)pSrc[1];
  iVar13 = (iVar8 + iVar7 + iVar5 + iVar9) * 0x25a1;
  iVar11 = (iVar5 + iVar9) * -0x3ec5 + iVar13;
  iVar13 = (iVar8 + iVar7) * -0xc7c + iVar13;
  iVar6 = (iVar5 + iVar7) * -0x5203;
  iVar12 = (iVar8 + iVar9) * -0x1ccd;
  iVar9 = iVar9 * 0x98e + iVar12 + iVar11;
  iVar11 = iVar5 * 0x6254 + iVar6 + iVar11;
  iVar5 = ((int)sVar2 + (int)sVar1) * 0x2000;
  iVar10 = iVar5 - iVar4;
  iVar6 = iVar7 * 0x41b3 + iVar6 + iVar13;
  iVar13 = iVar8 * 0x300b + iVar12 + iVar13;
  iVar4 = iVar5 + 0x400 + iVar4;
  *pTemp = iVar4 + iVar13 >> 0xb;
  iVar5 = ((int)sVar1 - (int)sVar2) * 0x2000;
  pTemp[7] = iVar4 - iVar13 >> 0xb;
  iVar4 = iVar5 - iVar3;
  iVar3 = iVar5 + 0x400 + iVar3;
  pTemp[1] = iVar3 + iVar11 >> 0xb;
  pTemp[6] = iVar3 - iVar11 >> 0xb;
  pTemp[2] = iVar4 + iVar6 + 0x400 >> 0xb;
  pTemp[5] = (iVar4 + 0x400) - iVar6 >> 0xb;
  pTemp[3] = iVar10 + iVar9 + 0x400 >> 0xb;
  pTemp[4] = (iVar10 + 0x400) - iVar9 >> 0xb;
  return;
}

Assistant:

static void idct(int* pTemp, const jpgd_block_t* pSrc) {
// ACCESS_COL() will be optimized at compile time to either an array access, or 0.
#define ACCESS_COL(x) (((x) < NONZERO_COLS) ? (int)pSrc[x] : 0)

    const int z2 = ACCESS_COL(2), z3 = ACCESS_COL(6);

    const int z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    const int tmp2 = z1 + MULTIPLY(z3, -FIX_1_847759065);
    const int tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    const int tmp0 = (ACCESS_COL(0) + ACCESS_COL(4)) << CONST_BITS;
    const int tmp1 = (ACCESS_COL(0) - ACCESS_COL(4)) << CONST_BITS;

    const int tmp10 = tmp0 + tmp3, tmp13 = tmp0 - tmp3, tmp11 = tmp1 + tmp2, tmp12 = tmp1 - tmp2;

    const int atmp0 = ACCESS_COL(7), atmp1 = ACCESS_COL(5), atmp2 = ACCESS_COL(3), atmp3 = ACCESS_COL(1);

    const int bz1 = atmp0 + atmp3, bz2 = atmp1 + atmp2, bz3 = atmp0 + atmp2, bz4 = atmp1 + atmp3;
    const int bz5 = MULTIPLY(bz3 + bz4, FIX_1_175875602);

    const int az1 = MULTIPLY(bz1, -FIX_0_899976223);
    const int az2 = MULTIPLY(bz2, -FIX_2_562915447);
    const int az3 = MULTIPLY(bz3, -FIX_1_961570560) + bz5;
    const int az4 = MULTIPLY(bz4, -FIX_0_390180644) + bz5;

    const int btmp0 = MULTIPLY(atmp0, FIX_0_298631336) + az1 + az3;
    const int btmp1 = MULTIPLY(atmp1, FIX_2_053119869) + az2 + az4;
    const int btmp2 = MULTIPLY(atmp2, FIX_3_072711026) + az2 + az3;
    const int btmp3 = MULTIPLY(atmp3, FIX_1_501321110) + az1 + az4;

    pTemp[0] = DESCALE(tmp10 + btmp3, CONST_BITS - PASS1_BITS);
    pTemp[7] = DESCALE(tmp10 - btmp3, CONST_BITS - PASS1_BITS);
    pTemp[1] = DESCALE(tmp11 + btmp2, CONST_BITS - PASS1_BITS);
    pTemp[6] = DESCALE(tmp11 - btmp2, CONST_BITS - PASS1_BITS);
    pTemp[2] = DESCALE(tmp12 + btmp1, CONST_BITS - PASS1_BITS);
    pTemp[5] = DESCALE(tmp12 - btmp1, CONST_BITS - PASS1_BITS);
    pTemp[3] = DESCALE(tmp13 + btmp0, CONST_BITS - PASS1_BITS);
    pTemp[4] = DESCALE(tmp13 - btmp0, CONST_BITS - PASS1_BITS);
  }